

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O1

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,PowConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
          *prepro)

{
  double dVar1;
  double __y;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  array<double,_4UL> rb;
  double local_38 [4];
  double local_18;
  
  lVar2 = (long)(c->
                super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
                args_._M_elems[0];
  local_18 = *(double *)(*(long *)(this + 0x40) + lVar2 * 8);
  if (0.0 <= local_18) {
    lVar4 = (long)(c->
                  super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>)
                  .args_._M_elems[1];
    dVar7 = *(double *)(*(long *)(this + 0x58) + lVar2 * 8);
    dVar1 = *(double *)(*(long *)(this + 0x40) + lVar4 * 8);
    __y = *(double *)(*(long *)(this + 0x58) + lVar4 * 8);
    if ((1e-10 <= local_18) || (1e-10 <= dVar1)) {
      local_38[0] = pow(local_18,dVar1);
      pdVar3 = local_38;
      local_38[1] = pow(local_18,__y);
      local_38[2] = pow(dVar7,dVar1);
      local_38[3] = pow(dVar7,__y);
      lVar2 = 8;
      do {
        if (*(double *)((long)local_38 + lVar2) <= *pdVar3 &&
            *pdVar3 != *(double *)((long)local_38 + lVar2)) {
          pdVar3 = (double *)((long)local_38 + lVar2);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
      dVar7 = *pdVar3;
      pdVar3 = local_38;
      lVar2 = 8;
      do {
        if (*pdVar3 <= *(double *)((long)local_38 + lVar2) &&
            *(double *)((long)local_38 + lVar2) != *pdVar3) {
          pdVar3 = (double *)((long)local_38 + lVar2);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
    }
    else {
      local_38[0] = pow(1e-10,dVar1);
      pdVar3 = local_38;
      local_38[1] = pow(1e-10,__y);
      local_38[2] = pow(dVar7,dVar1);
      local_38[3] = pow(dVar7,__y);
      lVar2 = 8;
      do {
        if (*(double *)((long)local_38 + lVar2) <= *pdVar3 &&
            *pdVar3 != *(double *)((long)local_38 + lVar2)) {
          pdVar3 = (double *)((long)local_38 + lVar2);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
      dVar7 = *pdVar3;
      pdVar3 = local_38;
      lVar2 = 8;
      do {
        if (*pdVar3 <= *(double *)((long)local_38 + lVar2) &&
            *(double *)((long)local_38 + lVar2) != *pdVar3) {
          pdVar3 = (double *)((long)local_38 + lVar2);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
    }
    dVar1 = *pdVar3;
    uVar5 = -(ulong)(prepro->lb_ < dVar7);
    uVar6 = -(ulong)(dVar1 < prepro->ub_);
    prepro->lb_ = (double)(~uVar5 & (ulong)prepro->lb_ | (ulong)dVar7 & uVar5);
    prepro->ub_ = (double)(~uVar6 & (ulong)prepro->ub_ | (ulong)dVar1 & uVar6);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstraint& c, PreprocessInfo& prepro) {
    auto x = c.GetArguments()[0];
    auto lbx = MPCD( lb(x) );
    if (lbx >= 0.0) {
      auto y = c.GetArguments()[1];
      auto ubx = MPCD( ub(x) );
      auto lby = MPCD( lb(y) );
      auto uby = MPCD( ub(y) );
      if (lbx >= 1e-10 || lby >= 1e-10) {
        std::array<double, 4> rb
            {std::pow(lbx, lby), std::pow(lbx, uby),
                                 std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      } else {
        std::array<double, 4> rb
            {std::pow(1e-10, lby), std::pow(1e-10, uby),
             std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      }
    }
  }